

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderInvarianceRule4Test::initTestIterations
          (TessellationShaderInvarianceRule4Test *this)

{
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_spacing _Var1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  long lVar5;
  _tessellation_levels *current_levels;
  pointer p_Var6;
  GLint gl_max_tess_gen_level_value;
  _tessellation_levels_set levels;
  _test_iteration test;
  
  iVar2 = (*((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))
            ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_glExtTokens.
             MAX_TESS_GEN_LEVEL);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x68f);
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    primitive_mode = (&DAT_017b3404)[lVar4];
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      _Var1 = (&DAT_017b3244)[lVar5];
      levels.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      levels.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      levels.
      super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                ((_tessellation_levels_set *)&test,primitive_mode,0,
                 TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
      std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      _M_move_assign(&levels,&test);
      std::_Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~_Vector_base((_Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                     *)&test);
      for (p_Var6 = levels.
                    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var6 != levels.
                    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                    ._M_impl.super__Vector_impl_data._M_finish; p_Var6 = p_Var6 + 1) {
        test.outer_tess_levels[0] = 0.0;
        test.outer_tess_levels[1] = 0.0;
        test.outer_tess_levels[2] = 0.0;
        test.outer_tess_levels[3] = 0.0;
        test.n_vertices = 0;
        test.inner_tess_levels = *&p_Var6->inner;
        for (lVar3 = 2; lVar3 != 6; lVar3 = lVar3 + 1) {
          test.inner_tess_levels[lVar3] = p_Var6->outer[0];
        }
        test.vertex_spacing = _Var1;
        test.primitive_mode = primitive_mode;
        std::
        vector<glcts::TessellationShaderInvarianceRule4Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule4Test::_test_iteration>_>
        ::push_back(&this->m_test_iterations,&test);
      }
      std::_Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
      ~_Vector_base(&levels.
                     super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                   );
    }
  }
  return;
}

Assistant:

void TessellationShaderInvarianceRule4Test::initTestIterations()
{
	DE_ASSERT(m_test_iterations.size() == 0);

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Iterate through all primitive and vertex spacing modes relevant to the test */
	_tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
													   TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	_tessellation_shader_vertex_spacing vs_modes[] = { TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
													   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
													   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD };

	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);
	const unsigned int n_vs_modes		 = sizeof(vs_modes) / sizeof(vs_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
		{
			_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

			/* Retrieve inner/outer tessellation level combinations we want the tests to be run for */
			_tessellation_levels_set levels;

			levels = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
				primitive_mode, gl_max_tess_gen_level_value,
				TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

			/* Iterate through all configurations */
			for (_tessellation_levels_set_const_iterator levels_iterator = levels.begin();
				 levels_iterator != levels.end(); levels_iterator++)
			{
				const _tessellation_levels& current_levels = *levels_iterator;

				/* Create a test descriptor for all the parameters we now have.
				 *
				 * The set we're operating on uses different outer tessellation level values, so we
				 * need to make sure the levels are set to the same FP values in order for the test
				 * to succeed. */
				_test_iteration test;

				memcpy(test.inner_tess_levels, current_levels.inner, sizeof(test.inner_tess_levels));

				for (int n = 0; n < 4 /* outer tess levels */; ++n)
				{
					test.outer_tess_levels[n] = current_levels.outer[0];
				}

				test.primitive_mode = primitive_mode;
				test.vertex_spacing = vs_mode;

				m_test_iterations.push_back(test);
			} /* for (all inner/outer tessellation levels) */
		}	 /* for (all vertex spacing modes) */
	}		  /* for (all primitive modes) */
}